

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void glcts::ArraysOfArrays::initTests<glcts::ArraysOfArrays::Interface::ES>
               (TestCaseGroup *group,Context *context)

{
  TestNode *pTVar1;
  
  initializeMap<glcts::ArraysOfArrays::Interface::ES>();
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsPrimitive<glcts::ArraysOfArrays::Interface::ES>::SizedDeclarationsPrimitive
            ((SizedDeclarationsPrimitive<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsStructTypes1<glcts::ArraysOfArrays::Interface::ES>::SizedDeclarationsStructTypes1
            ((SizedDeclarationsStructTypes1<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsStructTypes2<glcts::ArraysOfArrays::Interface::ES>::SizedDeclarationsStructTypes2
            ((SizedDeclarationsStructTypes2<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsStructTypes3<glcts::ArraysOfArrays::Interface::ES>::SizedDeclarationsStructTypes3
            ((SizedDeclarationsStructTypes3<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsStructTypes4<glcts::ArraysOfArrays::Interface::ES>::SizedDeclarationsStructTypes4
            ((SizedDeclarationsStructTypes4<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsTypenameStyle1<glcts::ArraysOfArrays::Interface::ES>::
  SizedDeclarationsTypenameStyle1
            ((SizedDeclarationsTypenameStyle1<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context
            );
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsTypenameStyle2<glcts::ArraysOfArrays::Interface::ES>::
  SizedDeclarationsTypenameStyle2
            ((SizedDeclarationsTypenameStyle2<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context
            );
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsTypenameStyle3<glcts::ArraysOfArrays::Interface::ES>::
  SizedDeclarationsTypenameStyle3
            ((SizedDeclarationsTypenameStyle3<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context
            );
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsTypenameStyle4<glcts::ArraysOfArrays::Interface::ES>::
  SizedDeclarationsTypenameStyle4
            ((SizedDeclarationsTypenameStyle4<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context
            );
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsTypenameStyle5<glcts::ArraysOfArrays::Interface::ES>::
  SizedDeclarationsTypenameStyle5
            ((SizedDeclarationsTypenameStyle5<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context
            );
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsFunctionParams<glcts::ArraysOfArrays::Interface::ES>::
  SizedDeclarationsFunctionParams
            ((SizedDeclarationsFunctionParams<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context
            );
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  sized_declarations_invalid_sizes1<glcts::ArraysOfArrays::Interface::ES>::
  sized_declarations_invalid_sizes1
            ((sized_declarations_invalid_sizes1<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,
             context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  sized_declarations_invalid_sizes2<glcts::ArraysOfArrays::Interface::ES>::
  sized_declarations_invalid_sizes2
            ((sized_declarations_invalid_sizes2<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,
             context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  sized_declarations_invalid_sizes3<glcts::ArraysOfArrays::Interface::ES>::
  sized_declarations_invalid_sizes3
            ((sized_declarations_invalid_sizes3<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,
             context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  sized_declarations_invalid_sizes4<glcts::ArraysOfArrays::Interface::ES>::
  sized_declarations_invalid_sizes4
            ((sized_declarations_invalid_sizes4<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,
             context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclConstructors1<glcts::ArraysOfArrays::Interface::ES>::
  ConstructorsAndUnsizedDeclConstructors1
            ((ConstructorsAndUnsizedDeclConstructors1<glcts::ArraysOfArrays::Interface::ES> *)pTVar1
             ,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclConstructors2<glcts::ArraysOfArrays::Interface::ES>::
  ConstructorsAndUnsizedDeclConstructors2
            ((ConstructorsAndUnsizedDeclConstructors2<glcts::ArraysOfArrays::Interface::ES> *)pTVar1
             ,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclUnsizedConstructors<glcts::ArraysOfArrays::Interface::ES>::
  ConstructorsAndUnsizedDeclUnsizedConstructors
            ((ConstructorsAndUnsizedDeclUnsizedConstructors<glcts::ArraysOfArrays::Interface::ES> *)
             pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclConst<glcts::ArraysOfArrays::Interface::ES>::
  ConstructorsAndUnsizedDeclConst
            ((ConstructorsAndUnsizedDeclConst<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context
            );
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclInvalidConstructors1<glcts::ArraysOfArrays::Interface::ES>::
  ConstructorsAndUnsizedDeclInvalidConstructors1
            ((ConstructorsAndUnsizedDeclInvalidConstructors1<glcts::ArraysOfArrays::Interface::ES> *
             )pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclInvalidConstructors2<glcts::ArraysOfArrays::Interface::ES>::
  ConstructorsAndUnsizedDeclInvalidConstructors2
            ((ConstructorsAndUnsizedDeclInvalidConstructors2<glcts::ArraysOfArrays::Interface::ES> *
             )pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclInvalidConstructors3<glcts::ArraysOfArrays::Interface::ES>::
  ConstructorsAndUnsizedDeclInvalidConstructors3
            ((ConstructorsAndUnsizedDeclInvalidConstructors3<glcts::ArraysOfArrays::Interface::ES> *
             )pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclInvalidConstructors4<glcts::ArraysOfArrays::Interface::ES>::
  ConstructorsAndUnsizedDeclInvalidConstructors4
            ((ConstructorsAndUnsizedDeclInvalidConstructors4<glcts::ArraysOfArrays::Interface::ES> *
             )pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclConstructorSizing1<glcts::ArraysOfArrays::Interface::ES>::
  ConstructorsAndUnsizedDeclConstructorSizing1
            ((ConstructorsAndUnsizedDeclConstructorSizing1<glcts::ArraysOfArrays::Interface::ES> *)
             pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclConstructorSizing2<glcts::ArraysOfArrays::Interface::ES>::
  ConstructorsAndUnsizedDeclConstructorSizing2
            ((ConstructorsAndUnsizedDeclConstructorSizing2<glcts::ArraysOfArrays::Interface::ES> *)
             pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::ES>::
  ConstructorsAndUnsizedDeclStructConstructors
            ((ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::ES> *)
             pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclUnsizedArrays1<glcts::ArraysOfArrays::Interface::ES>::
  ConstructorsAndUnsizedDeclUnsizedArrays1
            ((ConstructorsAndUnsizedDeclUnsizedArrays1<glcts::ArraysOfArrays::Interface::ES> *)
             pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclUnsizedArrays2<glcts::ArraysOfArrays::Interface::ES>::
  ConstructorsAndUnsizedDeclUnsizedArrays2
            ((ConstructorsAndUnsizedDeclUnsizedArrays2<glcts::ArraysOfArrays::Interface::ES> *)
             pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclUnsizedArrays3<glcts::ArraysOfArrays::Interface::ES>::
  ConstructorsAndUnsizedDeclUnsizedArrays3
            ((ConstructorsAndUnsizedDeclUnsizedArrays3<glcts::ArraysOfArrays::Interface::ES> *)
             pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclUnsizedArrays4<glcts::ArraysOfArrays::Interface::ES>::
  ConstructorsAndUnsizedDeclUnsizedArrays4
            ((ConstructorsAndUnsizedDeclUnsizedArrays4<glcts::ArraysOfArrays::Interface::ES> *)
             pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsAssignment1<glcts::ArraysOfArrays::Interface::ES>::ExpressionsAssignment1
            ((ExpressionsAssignment1<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsAssignment2<glcts::ArraysOfArrays::Interface::ES>::ExpressionsAssignment2
            ((ExpressionsAssignment2<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsAssignment3<glcts::ArraysOfArrays::Interface::ES>::ExpressionsAssignment3
            ((ExpressionsAssignment3<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsTypeRestrictions1<glcts::ArraysOfArrays::Interface::ES>::ExpressionsTypeRestrictions1
            ((ExpressionsTypeRestrictions1<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsTypeRestrictions2<glcts::ArraysOfArrays::Interface::ES>::ExpressionsTypeRestrictions2
            ((ExpressionsTypeRestrictions2<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsIndexingScalar1<glcts::ArraysOfArrays::Interface::ES>::ExpressionsIndexingScalar1
            ((ExpressionsIndexingScalar1<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsIndexingScalar2<glcts::ArraysOfArrays::Interface::ES>::ExpressionsIndexingScalar2
            ((ExpressionsIndexingScalar2<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsIndexingScalar3<glcts::ArraysOfArrays::Interface::ES>::ExpressionsIndexingScalar3
            ((ExpressionsIndexingScalar3<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsIndexingScalar4<glcts::ArraysOfArrays::Interface::ES>::ExpressionsIndexingScalar4
            ((ExpressionsIndexingScalar4<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsIndexingArray1<glcts::ArraysOfArrays::Interface::ES>::ExpressionsIndexingArray1
            ((ExpressionsIndexingArray1<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsIndexingArray2<glcts::ArraysOfArrays::Interface::ES>::ExpressionsIndexingArray2
            ((ExpressionsIndexingArray2<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsIndexingArray3<glcts::ArraysOfArrays::Interface::ES>::ExpressionsIndexingArray3
            ((ExpressionsIndexingArray3<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsDynamicIndexing1<glcts::ArraysOfArrays::Interface::ES>::ExpressionsDynamicIndexing1
            ((ExpressionsDynamicIndexing1<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsDynamicIndexing2<glcts::ArraysOfArrays::Interface::ES>::ExpressionsDynamicIndexing2
            ((ExpressionsDynamicIndexing2<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsEquality1<glcts::ArraysOfArrays::Interface::ES>::ExpressionsEquality1
            ((ExpressionsEquality1<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsEquality2<glcts::ArraysOfArrays::Interface::ES>::ExpressionsEquality2
            ((ExpressionsEquality2<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES>::ExpressionsLength1
            ((ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsLength2<glcts::ArraysOfArrays::Interface::ES>::ExpressionsLength2
            ((ExpressionsLength2<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsLength3<glcts::ArraysOfArrays::Interface::ES>::ExpressionsLength3
            ((ExpressionsLength3<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsInvalid1<glcts::ArraysOfArrays::Interface::ES>::ExpressionsInvalid1
            ((ExpressionsInvalid1<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsInvalid2<glcts::ArraysOfArrays::Interface::ES>::ExpressionsInvalid2
            ((ExpressionsInvalid2<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::ES>::InteractionFunctionCalls1
            ((InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionFunctionCalls2<glcts::ArraysOfArrays::Interface::ES>::InteractionFunctionCalls2
            ((InteractionFunctionCalls2<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionArgumentAliasing1<glcts::ArraysOfArrays::Interface::ES>::InteractionArgumentAliasing1
            ((InteractionArgumentAliasing1<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionArgumentAliasing2<glcts::ArraysOfArrays::Interface::ES>::InteractionArgumentAliasing2
            ((InteractionArgumentAliasing2<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionArgumentAliasing3<glcts::ArraysOfArrays::Interface::ES>::InteractionArgumentAliasing3
            ((InteractionArgumentAliasing3<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionArgumentAliasing4<glcts::ArraysOfArrays::Interface::ES>::InteractionArgumentAliasing4
            ((InteractionArgumentAliasing4<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionArgumentAliasing5<glcts::ArraysOfArrays::Interface::ES>::InteractionArgumentAliasing5
            ((InteractionArgumentAliasing5<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionArgumentAliasing6<glcts::ArraysOfArrays::Interface::ES>::InteractionArgumentAliasing6
            ((InteractionArgumentAliasing6<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>::InteractionUniforms1
            ((InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionUniforms2<glcts::ArraysOfArrays::Interface::ES>::InteractionUniforms2
            ((InteractionUniforms2<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionUniformBuffers1<glcts::ArraysOfArrays::Interface::ES>::InteractionUniformBuffers1
            ((InteractionUniformBuffers1<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionUniformBuffers2<glcts::ArraysOfArrays::Interface::ES>::InteractionUniformBuffers2
            ((InteractionUniformBuffers2<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::ES>::InteractionUniformBuffers3
            ((InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::ES>::InteractionInterfaceArrays
            ((InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::ES> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  return;
}

Assistant:

void initTests(TestCaseGroup& group, glcts::Context& context)
{
	// Set up the map
	ArraysOfArrays::initializeMap<API>();

	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsPrimitive<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsStructTypes1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsStructTypes2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsStructTypes3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsStructTypes4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle5<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsFunctionParams<API>(context));
	group.addChild(new glcts::ArraysOfArrays::sized_declarations_invalid_sizes1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::sized_declarations_invalid_sizes2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::sized_declarations_invalid_sizes3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::sized_declarations_invalid_sizes4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConstructors1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConstructors2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclUnsizedConstructors<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConst<API>(context));

	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclInvalidConstructors1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclInvalidConstructors2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclInvalidConstructors3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclInvalidConstructors4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConstructorSizing1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConstructorSizing2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclStructConstructors<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclUnsizedArrays1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclUnsizedArrays2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclUnsizedArrays3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclUnsizedArrays4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsAssignment1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsAssignment2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsAssignment3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsTypeRestrictions1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsTypeRestrictions2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingScalar1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingScalar2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingScalar3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingScalar4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingArray1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingArray2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingArray3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsDynamicIndexing1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsDynamicIndexing2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsEquality1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsEquality2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsLength1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsLength2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsLength3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsInvalid1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsInvalid2<API>(context));

	group.addChild(new glcts::ArraysOfArrays::InteractionFunctionCalls1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionFunctionCalls2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionArgumentAliasing1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionArgumentAliasing2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionArgumentAliasing3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionArgumentAliasing4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionArgumentAliasing5<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionArgumentAliasing6<API>(context));

	group.addChild(new glcts::ArraysOfArrays::InteractionUniforms1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionUniforms2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionUniformBuffers1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionUniformBuffers2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionUniformBuffers3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionInterfaceArrays<API>(context));

	if (API::USE_STORAGE_BLOCK)
	{
		group.addChild(new glcts::ArraysOfArrays::InteractionStorageBuffers1<API>(context));
		group.addChild(new glcts::ArraysOfArrays::InteractionStorageBuffers2<API>(context));
		group.addChild(new glcts::ArraysOfArrays::InteractionStorageBuffers3<API>(context));
	}

	if (API::USE_ATOMIC)
	{
		group.addChild(new glcts::ArraysOfArrays::AtomicDeclarationTest<API>(context));
		group.addChild(new glcts::ArraysOfArrays::AtomicUsageTest<API>(context));
	}

	if (API::USE_SUBROUTINE)
	{
		group.addChild(new glcts::ArraysOfArrays::SubroutineFunctionCalls1<API>(context));
		group.addChild(new glcts::ArraysOfArrays::SubroutineFunctionCalls2<API>(context));
		group.addChild(new glcts::ArraysOfArrays::SubroutineArgumentAliasing1<API>(context));
		group.addChild(new glcts::ArraysOfArrays::SubroutineArgumentAliasing2<API>(context));
		group.addChild(new glcts::ArraysOfArrays::SubroutineArgumentAliasing3<API>(context));
		group.addChild(new glcts::ArraysOfArrays::SubroutineArgumentAliasing4<API>(context));
	}
}